

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O1

bool __thiscall anon_unknown.dwarf_145cfbe::DescriptorImpl::IsSolvable(DescriptorImpl *this)

{
  long lVar1;
  pointer puVar2;
  char cVar3;
  int iVar4;
  pointer puVar5;
  long in_FS_OFFSET;
  bool bVar6;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  puVar5 = (this->m_subdescriptor_args).
           super__Vector_base<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (this->m_subdescriptor_args).
           super__Vector_base<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar6 = puVar5 == puVar2;
  if (!bVar6) {
    iVar4 = (*(((puVar5->_M_t).
                super___uniq_ptr_impl<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>
                ._M_t.
                super__Tuple_impl<0UL,_(anonymous_namespace)::DescriptorImpl_*,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>
                .super__Head_base<0UL,_(anonymous_namespace)::DescriptorImpl_*,_false>._M_head_impl)
              ->super_Descriptor)._vptr_Descriptor[3])();
    cVar3 = (char)iVar4;
    while (cVar3 != '\0') {
      puVar5 = puVar5 + 1;
      bVar6 = puVar5 == puVar2;
      if (bVar6) break;
      iVar4 = (*(((puVar5->_M_t).
                  super___uniq_ptr_impl<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_(anonymous_namespace)::DescriptorImpl_*,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>
                  .super__Head_base<0UL,_(anonymous_namespace)::DescriptorImpl_*,_false>.
                 _M_head_impl)->super_Descriptor)._vptr_Descriptor[3])();
      cVar3 = (char)iVar4;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar6;
  }
  __stack_chk_fail();
}

Assistant:

bool IsSolvable() const override
    {
        for (const auto& arg : m_subdescriptor_args) {
            if (!arg->IsSolvable()) return false;
        }
        return true;
    }